

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void encode_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
              int mi_row,int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PC_TREE *pc_tree,int *rate)

{
  aom_cdf_prob *paVar1;
  byte partition;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  FRAME_CONTEXT *pFVar5;
  short sVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  BLOCK_SIZE bsize_00;
  ulong uVar10;
  BLOCK_SIZE bsize_01;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  PARTITION_TYPE partition_00;
  int *in_stack_ffffffffffffff60;
  PICK_MODE_CONTEXT *ctx;
  int *in_stack_ffffffffffffff68;
  
  uVar7 = (ulong)bsize;
  uVar9 = 0xffffffff;
  if (2 < uVar7) {
    uVar9 = ""[uVar7] - 1;
    uVar9 = ((uint)(((uint)(int)(td->mb).e_mbd.above_partition_context[mi_col] >> (uVar9 & 0x1f) & 1
                    ) != 0) +
             ((uint)(int)(td->mb).e_mbd.left_partition_context[mi_row & 0x1f] >>
              ((byte)uVar9 & 0x1f) & 1) * 2 + (uint)""[uVar7] * 4) - 4;
  }
  partition = pc_tree->partitioning;
  uVar14 = (ulong)partition;
  bsize_01 = BLOCK_INVALID;
  uVar12 = (ulong)bsize;
  bsize_00 = BLOCK_INVALID;
  if (uVar14 != 0xff) {
    bsize_00 = BLOCK_INVALID;
    switch(uVar12) {
    case 0:
      uVar10 = uVar12;
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
      goto switchD_001e76ac_caseD_1;
    case 3:
      uVar10 = 1;
      break;
    case 6:
      uVar10 = 2;
      break;
    case 9:
      uVar10 = 3;
      break;
    default:
      if (bsize == BLOCK_64X64) {
        uVar10 = 4;
      }
      else {
        bsize_00 = BLOCK_INVALID;
        if (bsize != BLOCK_128X128) goto switchD_001e76ac_caseD_1;
        uVar10 = 5;
      }
    }
    bsize_00 = subsize_lookup[uVar14][uVar10];
  }
switchD_001e76ac_caseD_1:
  switch(uVar12) {
  case 0:
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
    goto switchD_001e7704_caseD_1;
  case 3:
    uVar12 = 1;
    break;
  case 6:
    uVar12 = 2;
    break;
  case 9:
    uVar12 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar12 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001e7704_caseD_1;
      uVar12 = 5;
    }
  }
  bsize_01 = subsize_lookup[3][uVar12];
switchD_001e7704_caseD_1:
  iVar17 = (cpi->common).mi_params.mi_rows;
  if (((iVar17 <= mi_row) || (iVar13 = (cpi->common).mi_params.mi_cols, iVar13 <= mi_col)) ||
     (bsize_00 == BLOCK_INVALID)) {
    return;
  }
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar7];
  uVar16 = (uint)(bVar2 >> 1);
  if (((dry_run == '\0') && (-1 < (int)uVar9)) &&
     (((int)(mi_col + uVar16) < iVar13 && (int)(uVar16 + mi_row) < iVar17 &&
      (tile_data->allow_update_cdf != '\0')))) {
    pFVar5 = (td->mb).e_mbd.tile_ctx;
    uVar7 = 4;
    if (BLOCK_8X8 < bsize) {
      uVar7 = (ulong)((bsize != BLOCK_128X128) + 8 + (uint)(bsize != BLOCK_128X128));
    }
    uVar3 = pFVar5->partition_cdf[uVar9][uVar7];
    bVar8 = (char)(uVar3 >> 4) + 5;
    uVar12 = 0;
    do {
      uVar4 = pFVar5->partition_cdf[uVar9][uVar12];
      if ((long)uVar12 < (long)(char)partition) {
        sVar6 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar8 & 0x1f));
      }
      else {
        sVar6 = -(uVar4 >> (bVar8 & 0x1f));
      }
      pFVar5->partition_cdf[uVar9][uVar12] = sVar6 + uVar4;
      uVar12 = uVar12 + 1;
    } while ((int)uVar7 - 1 != uVar12);
    paVar1 = pFVar5->partition_cdf[uVar9] + uVar7;
    *paVar1 = *paVar1 + (ushort)(uVar3 < 0x20);
  }
  if (9 < partition) goto LAB_001e7e33;
  bVar2 = bVar2 >> 2;
  iVar17 = mi_row;
  iVar13 = mi_col;
  switch(uVar14) {
  case 0:
    ctx = pc_tree->none;
    partition_00 = '\0';
    bsize_01 = bsize_00;
    break;
  case 1:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_00,'\x01',pc_tree->horizontal[0],
             in_stack_ffffffffffffff68);
    iVar17 = uVar16 + mi_row;
    if ((cpi->common).mi_params.mi_rows <= iVar17) goto LAB_001e7e33;
    ctx = pc_tree->horizontal[1];
    partition_00 = '\x01';
    bsize_01 = bsize_00;
    break;
  case 2:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_00,'\x02',pc_tree->vertical[0],
             in_stack_ffffffffffffff68);
    if ((cpi->common).mi_params.mi_cols <= (int)(uVar16 + mi_col)) goto LAB_001e7e33;
    ctx = pc_tree->vertical[1];
    partition_00 = '\x02';
    iVar13 = uVar16 + mi_col;
    bsize_01 = bsize_00;
    break;
  case 3:
    encode_sb(cpi,td,tile_data,tp,mi_row,mi_col,dry_run,bsize_00,pc_tree->split[0],
              in_stack_ffffffffffffff60);
    encode_sb(cpi,td,tile_data,tp,mi_row,uVar16 + mi_col,dry_run,bsize_00,pc_tree->split[1],
              in_stack_ffffffffffffff60);
    encode_sb(cpi,td,tile_data,tp,uVar16 + mi_row,mi_col,dry_run,bsize_00,pc_tree->split[2],
              in_stack_ffffffffffffff60);
    encode_sb(cpi,td,tile_data,tp,uVar16 + mi_row,uVar16 + mi_col,dry_run,bsize_00,pc_tree->split[3]
              ,in_stack_ffffffffffffff60);
    goto LAB_001e7e33;
  case 4:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_01,'\x04',pc_tree->horizontala[0],
             in_stack_ffffffffffffff68);
    encode_b(cpi,tile_data,td,tp,mi_row,uVar16 + mi_col,dry_run,bsize_01,'\x04',
             pc_tree->horizontala[1],in_stack_ffffffffffffff68);
    ctx = pc_tree->horizontala[2];
    partition_00 = '\x04';
    iVar17 = uVar16 + mi_row;
    bsize_01 = bsize_00;
    break;
  case 5:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_00,'\x05',pc_tree->horizontalb[0],
             in_stack_ffffffffffffff68);
    encode_b(cpi,tile_data,td,tp,uVar16 + mi_row,mi_col,dry_run,bsize_01,'\x05',
             pc_tree->horizontalb[1],in_stack_ffffffffffffff68);
    ctx = pc_tree->horizontalb[2];
    partition_00 = '\x05';
    iVar17 = uVar16 + mi_row;
    iVar13 = uVar16 + mi_col;
    break;
  case 6:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_01,'\x06',pc_tree->verticala[0],
             in_stack_ffffffffffffff68);
    encode_b(cpi,tile_data,td,tp,uVar16 + mi_row,mi_col,dry_run,bsize_01,'\x06',
             pc_tree->verticala[1],in_stack_ffffffffffffff68);
    ctx = pc_tree->verticala[2];
    partition_00 = '\x06';
    bsize_01 = bsize_00;
    goto LAB_001e7e28;
  case 7:
    encode_b(cpi,tile_data,td,tp,mi_row,mi_col,dry_run,bsize_00,'\a',pc_tree->verticalb[0],
             in_stack_ffffffffffffff68);
    encode_b(cpi,tile_data,td,tp,mi_row,uVar16 + mi_col,dry_run,bsize_01,'\a',pc_tree->verticalb[1],
             in_stack_ffffffffffffff68);
    ctx = pc_tree->verticalb[2];
    partition_00 = '\a';
    iVar17 = uVar16 + mi_row;
LAB_001e7e28:
    iVar13 = uVar16 + mi_col;
    break;
  case 8:
    lVar11 = (long)mi_row;
    lVar15 = 0;
    do {
      if ((lVar15 != 0) && ((cpi->common).mi_params.mi_rows <= lVar11)) break;
      encode_b(cpi,tile_data,td,tp,(int)lVar11,mi_col,dry_run,bsize_00,'\b',
               pc_tree->horizontal4[lVar15],in_stack_ffffffffffffff68);
      lVar15 = lVar15 + 1;
      lVar11 = lVar11 + (ulong)bVar2;
    } while (lVar15 != 4);
    goto LAB_001e7e33;
  case 9:
    lVar11 = (long)mi_col;
    lVar15 = 0;
    do {
      if ((lVar15 != 0) && ((cpi->common).mi_params.mi_cols <= lVar11)) break;
      encode_b(cpi,tile_data,td,tp,mi_row,(int)lVar11,dry_run,bsize_00,'\t',
               pc_tree->vertical4[lVar15],in_stack_ffffffffffffff68);
      lVar15 = lVar15 + 1;
      lVar11 = lVar11 + (ulong)bVar2;
    } while (lVar15 != 4);
    goto LAB_001e7e33;
  }
  encode_b(cpi,tile_data,td,tp,iVar17,iVar13,dry_run,bsize_01,partition_00,ctx,
           in_stack_ffffffffffffff68);
LAB_001e7e33:
  update_ext_partition_context(&(td->mb).e_mbd,mi_row,mi_col,bsize_00,bsize,partition);
  return;
}

Assistant:

static void encode_sb(const AV1_COMP *const cpi, ThreadData *td,
                      TileDataEnc *tile_data, TokenExtra **tp, int mi_row,
                      int mi_col, RUN_TYPE dry_run, BLOCK_SIZE bsize,
                      PC_TREE *pc_tree, int *rate) {
  assert(bsize < BLOCK_SIZES_ALL);
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  assert(bsize < BLOCK_SIZES_ALL);
  const int hbs = mi_size_wide[bsize] / 2;
  const int is_partition_root = bsize >= BLOCK_8X8;
  const int ctx = is_partition_root
                      ? partition_plane_context(xd, mi_row, mi_col, bsize)
                      : -1;
  const PARTITION_TYPE partition = pc_tree->partitioning;
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
#if !CONFIG_REALTIME_ONLY
  int quarter_step = mi_size_wide[bsize] / 4;
  int i;
  BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
#endif

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;
  if (subsize == BLOCK_INVALID) return;

  if (!dry_run && ctx >= 0) {
    const int has_rows = (mi_row + hbs) < mi_params->mi_rows;
    const int has_cols = (mi_col + hbs) < mi_params->mi_cols;

    if (has_rows && has_cols) {
#if CONFIG_ENTROPY_STATS
      td->counts->partition[ctx][partition]++;
#endif

      if (tile_data->allow_update_cdf) {
        FRAME_CONTEXT *fc = xd->tile_ctx;
        update_cdf(fc->partition_cdf[ctx], partition,
                   partition_cdf_length(bsize));
      }
    }
  }

  switch (partition) {
    case PARTITION_NONE:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->none, rate);
      break;
    case PARTITION_VERT:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->vertical[0], rate);
      if (mi_col + hbs < mi_params->mi_cols) {
        encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, subsize,
                 partition, pc_tree->vertical[1], rate);
      }
      break;
    case PARTITION_HORZ:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->horizontal[0], rate);
      if (mi_row + hbs < mi_params->mi_rows) {
        encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, subsize,
                 partition, pc_tree->horizontal[1], rate);
      }
      break;
    case PARTITION_SPLIT:
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, dry_run, subsize,
                pc_tree->split[0], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col + hbs, dry_run, subsize,
                pc_tree->split[1], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row + hbs, mi_col, dry_run, subsize,
                pc_tree->split[2], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row + hbs, mi_col + hbs, dry_run,
                subsize, pc_tree->split[3], rate);
      break;

#if !CONFIG_REALTIME_ONLY
    case PARTITION_HORZ_A:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, bsize2,
               partition, pc_tree->horizontala[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, bsize2,
               partition, pc_tree->horizontala[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, subsize,
               partition, pc_tree->horizontala[2], rate);
      break;
    case PARTITION_HORZ_B:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->horizontalb[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, bsize2,
               partition, pc_tree->horizontalb[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col + hbs, dry_run,
               bsize2, partition, pc_tree->horizontalb[2], rate);
      break;
    case PARTITION_VERT_A:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, bsize2,
               partition, pc_tree->verticala[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, bsize2,
               partition, pc_tree->verticala[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, subsize,
               partition, pc_tree->verticala[2], rate);

      break;
    case PARTITION_VERT_B:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->verticalb[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, bsize2,
               partition, pc_tree->verticalb[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col + hbs, dry_run,
               bsize2, partition, pc_tree->verticalb[2], rate);
      break;
    case PARTITION_HORZ_4:
      for (i = 0; i < SUB_PARTITIONS_PART4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= mi_params->mi_rows) break;

        encode_b(cpi, tile_data, td, tp, this_mi_row, mi_col, dry_run, subsize,
                 partition, pc_tree->horizontal4[i], rate);
      }
      break;
    case PARTITION_VERT_4:
      for (i = 0; i < SUB_PARTITIONS_PART4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= mi_params->mi_cols) break;
        encode_b(cpi, tile_data, td, tp, mi_row, this_mi_col, dry_run, subsize,
                 partition, pc_tree->vertical4[i], rate);
      }
      break;
#endif
    default: assert(0 && "Invalid partition type."); break;
  }

  update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}